

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

double helics::getDoubleFromString(string_view val)

{
  string_view val_00;
  string_view val_01;
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  char *in_RSI;
  size_t in_RDI;
  double dVar6;
  complex<double> cval;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> complexVal;
  vector<double,_std::allocator<double>_> vectorVal;
  undefined1 in_stack_00000108 [16];
  complex<double> *in_stack_ffffffffffffff20;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *local_b8;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  complex<double> local_88;
  size_t local_78;
  char *local_70;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_68;
  size_t local_40;
  char *local_38;
  vector<double,_std::allocator<double>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  vector<double,_std::allocator<double>_> *local_8;
  
  local_18._M_len = in_RDI;
  local_18._M_str = in_RSI;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (bVar1) {
    local_8 = (vector<double,_std::allocator<double>_> *)invalidValue<double>();
  }
  else {
    pvVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front(&local_18);
    if ((*pvVar2 == 'v') ||
       (pvVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front(&local_18),
       *pvVar2 == '[')) {
      local_40 = local_18._M_len;
      local_38 = local_18._M_str;
      val_00._M_str = in_stack_ffffffffffffff58;
      val_00._M_len = in_stack_ffffffffffffff50;
      helicsGetVector(val_00);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_30);
      if (sVar3 == 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0);
        local_8 = (vector<double,_std::allocator<double>_> *)*pvVar4;
      }
      else {
        local_8 = (vector<double,_std::allocator<double>_> *)vectorNorm(in_stack_ffffffffffffff30);
      }
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff30);
    }
    else {
      pvVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front(&local_18);
      if (*pvVar2 == 'c') {
        local_78 = local_18._M_len;
        local_70 = local_18._M_str;
        val_01._M_str = in_stack_ffffffffffffff58;
        val_01._M_len = in_stack_ffffffffffffff50;
        helicsGetComplexVector(val_01);
        sVar3 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                          (&local_68);
        if (sVar3 == 1) {
          pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                   operator[](&local_68,0);
          dVar6 = std::complex<double>::imag_abi_cxx11_(pvVar5);
          if ((dVar6 != 0.0) || (NAN(dVar6))) {
            std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                      (&local_68,0);
            in_stack_ffffffffffffff30 =
                 (vector<double,_std::allocator<double>_> *)
                 std::abs<double>(in_stack_ffffffffffffff20);
            local_b8 = in_stack_ffffffffffffff30;
          }
          else {
            pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                     operator[](&local_68,0);
            in_stack_ffffffffffffff30 =
                 (vector<double,_std::allocator<double>_> *)
                 std::complex<double>::real_abi_cxx11_(pvVar5);
            local_b8 = in_stack_ffffffffffffff30;
          }
        }
        else {
          local_b8 = (vector<double,_std::allocator<double>_> *)
                     vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                 *)in_stack_ffffffffffffff30);
        }
        local_8 = local_b8;
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_ffffffffffffff30);
      }
      else {
        helicsGetComplex((string_view)in_stack_00000108);
        dVar6 = std::complex<double>::imag_abi_cxx11_(&local_88);
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          local_8 = (vector<double,_std::allocator<double>_> *)
                    std::abs<double>(in_stack_ffffffffffffff20);
        }
        else {
          local_8 = (vector<double,_std::allocator<double>_> *)
                    std::complex<double>::real_abi_cxx11_(&local_88);
        }
      }
    }
  }
  return (double)local_8;
}

Assistant:

double getDoubleFromString(std::string_view val)
{
    if (val.empty()) {
        return invalidValue<double>();
    }
    if (val.front() == 'v' || val.front() == '[') {
        auto vectorVal = helicsGetVector(val);
        return (vectorVal.size() != 1) ? vectorNorm(vectorVal) : vectorVal[0];
    }
    if (val.front() == 'c') {
        auto complexVal = helicsGetComplexVector(val);
        return (complexVal.size() != 1) ?
            vectorNorm(complexVal) :
            ((complexVal[0].imag() == 0.0) ? complexVal[0].real() : std::abs(complexVal[0]));
    }
    auto cval = helicsGetComplex(val);
    return (cval.imag() == 0.0) ? cval.real() : std::abs(cval);
}